

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no-prefix-set.cpp
# Opt level: O1

bool __thiscall Trie<char,_10UL,_'a'>::good(Trie<char,_10UL,__a_> *this,string *word)

{
  ulong uVar1;
  difference_type __n;
  undefined8 *puVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  bool bVar6;
  bool bVar7;
  
  uVar1 = word->_M_string_length;
  bVar6 = uVar1 != 0;
  if (bVar6) {
    uVar4 = 1;
    do {
      lVar5 = (long)(word->_M_dataplus)._M_p[uVar4 - 1];
      if (*(long *)((long)this + lVar5 * 8 + -0x308) == 0) {
        puVar2 = (undefined8 *)operator_new(0x58);
        *puVar2 = 0;
        puVar2[1] = 0;
        puVar2[2] = 0;
        puVar2[3] = 0;
        puVar2[4] = 0;
        puVar2[5] = 0;
        puVar2[6] = 0;
        puVar2[7] = 0;
        puVar2[8] = 0;
        puVar2[9] = 0;
        puVar2[10] = 0;
        *(undefined8 **)((long)this + lVar5 * 8 + -0x308) = puVar2;
      }
      this = *(Trie<char,_10UL,__a_> **)((long)this + lVar5 * 8 + -0x308);
      if (this->counter != 0) break;
      bVar6 = uVar4 < uVar1;
      bVar7 = uVar4 != uVar1;
      uVar4 = uVar4 + 1;
    } while (bVar7);
  }
  if (bVar6) {
    bVar6 = false;
  }
  else {
    this->counter = this->counter + 1;
    lVar5 = 0;
    lVar3 = 0;
    do {
      lVar5 = lVar5 + (ulong)(*(long *)((long)this->nodes + lVar3) == 0);
      lVar3 = lVar3 + 8;
    } while (lVar3 != 0x50);
    bVar6 = lVar5 == 10;
  }
  return bVar6;
}

Assistant:

bool good(const std::string &word) {
    auto root = this;
    for (auto i = 0; i < word.size(); ++i) {
      auto index = word[i] - offset;
      if (root->nodes[index] == nullptr) {
        root->nodes[index] = new Trie<Element, N, offset>();
      }
      root = root->nodes[index];
      if (root->counter != 0) {
        return false;
      }
    }
    root->counter += 1;
    return std::count(root->nodes, root->nodes + N, nullptr) == N;
  }